

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_element.c
# Opt level: O0

apx_error_t
derive_hash_init_value(apx_dataElement_t *self,dtl_av_t *parsed_av,dtl_hv_t **derived_hv)

{
  apx_error_t aVar1;
  int32_t iVar2;
  apx_dataElement_t *self_00;
  char *pKey;
  char *child_name;
  apx_dataElement_t *child_element;
  dtl_dv_t *derived_dv;
  dtl_dv_t *parsed_dv;
  apx_dataElement_t *derived_element;
  int local_38;
  apx_error_t result;
  int32_t i;
  int32_t num_children;
  dtl_hv_t *hv;
  dtl_hv_t **derived_hv_local;
  dtl_av_t *parsed_av_local;
  apx_dataElement_t *self_local;
  
  hv = (dtl_hv_t *)derived_hv;
  derived_hv_local = (dtl_hv_t **)parsed_av;
  parsed_av_local = (dtl_av_t *)self;
  result = apx_dataElement_get_num_child_elements(self);
  _i = (adt_hash_t *)dtl_hv_new();
  aVar1 = result;
  if (_i == (adt_hash_t *)0x0) {
    self_local._4_4_ = 2;
  }
  else {
    iVar2 = dtl_av_length((dtl_av_t *)derived_hv_local);
    if (aVar1 == iVar2) {
      for (local_38 = 0; local_38 < result; local_38 = local_38 + 1) {
        parsed_dv = (dtl_dv_t *)0x0;
        derived_dv = (dtl_dv_t *)0x0;
        child_element = (apx_dataElement_t *)0x0;
        self_00 = apx_dataElement_get_child_at((apx_dataElement_t *)parsed_av_local,local_38);
        if (self_00 == (apx_dataElement_t *)0x0) {
          __assert_fail("child_element != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/data_element.c"
                        ,0x3cf,
                        "apx_error_t derive_hash_init_value(apx_dataElement_t *, dtl_av_t *, dtl_hv_t **)"
                       );
        }
        pKey = apx_dataElement_get_name(self_00);
        if (pKey == (char *)0x0) {
          __assert_fail("child_name != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/data_element.c"
                        ,0x3d1,
                        "apx_error_t derive_hash_init_value(apx_dataElement_t *, dtl_av_t *, dtl_hv_t **)"
                       );
        }
        derived_element._4_4_ =
             apx_dataElement_derive_data_element
                       (self_00,(apx_dataElement_t **)&parsed_dv,(apx_dataElement_t **)0x0);
        if (derived_element._4_4_ != 0) {
          dtl_hv_delete((dtl_hv_t *)_i);
          return derived_element._4_4_;
        }
        if (parsed_dv == (dtl_dv_t *)0x0) {
          __assert_fail("derived_element != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/data_element.c"
                        ,0x3d8,
                        "apx_error_t derive_hash_init_value(apx_dataElement_t *, dtl_av_t *, dtl_hv_t **)"
                       );
        }
        derived_dv = dtl_av_value((dtl_av_t *)derived_hv_local,local_38);
        derived_element._4_4_ =
             apx_dataElement_derive_proper_init_value
                       ((apx_dataElement_t *)parsed_dv,derived_dv,(dtl_dv_t **)&child_element);
        if (derived_element._4_4_ != 0) {
          if (child_element == (apx_dataElement_t *)0x0) {
            dtl_hv_delete((dtl_hv_t *)_i);
            return derived_element._4_4_;
          }
          __assert_fail("derived_dv == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/data_element.c"
                        ,0x3dd,
                        "apx_error_t derive_hash_init_value(apx_dataElement_t *, dtl_av_t *, dtl_hv_t **)"
                       );
        }
        dtl_hv_set_cstr((dtl_hv_t *)_i,pKey,(dtl_dv_t *)child_element,false);
      }
      hv->pAny = _i;
      self_local._4_4_ = 0;
    }
    else {
      self_local._4_4_ = 0x46;
    }
  }
  return self_local._4_4_;
}

Assistant:

static apx_error_t derive_hash_init_value(apx_dataElement_t* self, dtl_av_t* parsed_av, dtl_hv_t** derived_hv)
{
   dtl_hv_t* hv;
   int32_t num_children = apx_dataElement_get_num_child_elements(self);
   hv = dtl_hv_new();
   if (hv == NULL)
   {
      return APX_MEM_ERROR;
   }
   if (num_children != dtl_av_length(parsed_av))
   {
      return APX_VALUE_LENGTH_ERROR;
   }
   for (int32_t i = 0; i < num_children; i++)
   {
      apx_error_t result;
      apx_dataElement_t* derived_element = NULL;      
      dtl_dv_t* parsed_dv = NULL;
      dtl_dv_t* derived_dv = NULL;
      apx_dataElement_t* child_element = apx_dataElement_get_child_at(self, i);
      char const* child_name = NULL;
      assert(child_element != NULL);
      child_name = apx_dataElement_get_name(child_element);
      assert(child_name != NULL);
      result = apx_dataElement_derive_data_element(child_element, &derived_element, NULL);
      if (result != APX_NO_ERROR)
      {
         dtl_hv_delete(hv);
         return result;
      }
      assert(derived_element != NULL);
      parsed_dv = dtl_av_value(parsed_av, i);
      result = apx_dataElement_derive_proper_init_value(derived_element, parsed_dv, &derived_dv);
      if (result != APX_NO_ERROR)
      {
         assert(derived_dv == NULL);
         dtl_hv_delete(hv);
         return result;
      }      
      dtl_hv_set_cstr(hv, child_name, derived_dv, false);
   }
   *derived_hv = hv;
   return APX_NO_ERROR;
}